

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::VectorRasterizerTests::InterCellIndividualHLineIsRepresentedBySparsedCells
          (VectorRasterizerTests *this)

{
  cells_container *pcVar1;
  allocator local_171;
  string local_170 [32];
  LocationInfo local_150;
  undefined1 local_128 [8];
  cell reference2 [3];
  allocator local_101;
  string local_100 [32];
  LocationInfo local_e0;
  undefined1 local_b8 [8];
  cell reference1 [3];
  undefined1 local_88 [8];
  vector_rasterizer vr;
  VectorRasterizerTests *this_local;
  
  vr._112_8_ = this;
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_88);
  vector_rasterizer::line((vector_rasterizer *)local_88,0,0,0x5ff,3);
  reference1[0].cover = 0;
  reference1[1].x = 1;
  reference1[1].y = 5;
  reference1[1].area = 0xff0000;
  reference1[1].cover = 0;
  reference1[2].x = 1;
  local_b8._0_2_ = 1;
  local_b8._2_2_ = 0;
  local_b8._4_4_ = 0x100;
  reference1[0]._0_6_ = 0x30001;
  reference1[0].area._2_2_ = 0x100;
  pcVar1 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_101);
  ut::LocationInfo::LocationInfo(&local_e0,(string *)local_100,0x2e3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_b8,pcVar1,&local_e0);
  ut::LocationInfo::~LocationInfo(&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  vector_rasterizer::reset((vector_rasterizer *)local_88);
  vector_rasterizer::line((vector_rasterizer *)local_88,-0x100,0x100,0xaff,0x103);
  reference2[0].cover = 0;
  reference2[1].x = 1;
  reference2[1].y = 10;
  reference2[1].area = 0xff0001;
  reference2[1].cover = 0;
  reference2[2].x = 1;
  local_128._0_2_ = 2;
  local_128._2_2_ = 1;
  local_128._4_4_ = 0x100;
  reference2[0]._0_6_ = 0x100060001;
  reference2[0].area._2_2_ = 0x100;
  pcVar1 = vector_rasterizer::cells((vector_rasterizer *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_171);
  ut::LocationInfo::LocationInfo(&local_150,(string *)local_170,0x2f2);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_128,pcVar1,&local_150);
  ut::LocationInfo::~LocationInfo(&local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_88);
  return;
}

Assistant:

test( InterCellIndividualHLineIsRepresentedBySparsedCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(0, 0, 1535, 3); // dx = 6 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, 0, 256, 1 },
					{ 3, 0, 256, 1 },
					{ 5, 0, 255, 1 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(-256, 256, 2815, 259); // dx = 12 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 2, 1, 256, 1 },
					{ 6, 1, 256, 1 },
					{ 10, 1, 255, 1 },
				};

				assert_equal(reference2, vr.cells());
			}